

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::GetInteger64Verifier::verifyBoolean4
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,bool reference0,
          bool reference1,bool reference2,bool reference3)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  long (*palVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_228;
  long local_a8;
  GLint64 referenceAsGLint64 [4];
  undefined1 local_80 [8];
  StateQueryMemoryWriteGuard<long[4]> boolVector4;
  bool reference3_local;
  bool reference2_local;
  bool reference1_local;
  bool reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  boolVector4.m_postguard[3]._0_1_ = reference3;
  boolVector4.m_postguard[3]._1_1_ = reference2;
  boolVector4.m_postguard[3]._2_1_ = reference1;
  boolVector4.m_postguard[3]._3_1_ = reference0;
  boolVector4.m_postguard[3]._4_4_ = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long[4]> *)local_80);
  pname = boolVector4.m_postguard[3]._4_4_;
  palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_80);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,pname,*palVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long[4]> *)local_80,testCtx);
  if (bVar1) {
    local_a8 = (long)(int)(uint)((boolVector4.m_postguard[3]._3_1_ & 1) != 0);
    referenceAsGLint64[0] = (GLint64)(int)(uint)((boolVector4.m_postguard[3]._2_1_ & 1) != 0);
    referenceAsGLint64[1] = (GLint64)(int)(uint)((boolVector4.m_postguard[3]._1_1_ & 1) != 0);
    referenceAsGLint64[2] = (GLint64)(int)(uint)(((byte)boolVector4.m_postguard[3] & 1) != 0);
    palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_80);
    if (((((*palVar3)[0] != local_a8) ||
         (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_80),
         (*palVar3)[1] != referenceAsGLint64[0])) ||
        (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_80),
        (*palVar3)[2] != referenceAsGLint64[1])) ||
       (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_80),
       (*palVar3)[3] != referenceAsGLint64[2])) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_228,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_228,(char (*) [20])"// ERROR: expected ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_a8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,referenceAsGLint64);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,referenceAsGLint64 + 1);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,referenceAsGLint64 + 2);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_228);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64[4]> boolVector4;
	glGetInteger64v(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLint64 referenceAsGLint64[] =
	{
		reference0 ? 1 : 0,
		reference1 ? 1 : 0,
		reference2 ? 1 : 0,
		reference3 ? 1 : 0,
	};

	if (boolVector4[0] != referenceAsGLint64[0] ||
		boolVector4[1] != referenceAsGLint64[1] ||
		boolVector4[2] != referenceAsGLint64[2] ||
		boolVector4[3] != referenceAsGLint64[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< referenceAsGLint64[0] << " "
			<< referenceAsGLint64[1] << " "
			<< referenceAsGLint64[2] << " "
			<< referenceAsGLint64[3] << " " << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}